

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cc
# Opt level: O0

void __thiscall
kratos::ModuleInstantiationVisitor::visit(ModuleInstantiationVisitor *this,Generator *generator)

{
  bool bVar1;
  __shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar2;
  bool *pbVar3;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
  *puVar4;
  mapped_type *pmVar5;
  element_type *peVar6;
  ulong uVar7;
  unordered_set<kratos::AssignStmt_*,_std::hash<kratos::AssignStmt_*>,_std::equal_to<kratos::AssignStmt_*>,_std::allocator<kratos::AssignStmt_*>_>
  *this_01;
  reference ppAVar8;
  element_type *stmt_00;
  pair<const_char_*,_int> pVar9;
  value_type *st;
  const_iterator __end3;
  const_iterator __begin3;
  unordered_set<kratos::AssignStmt_*,_std::hash<kratos::AssignStmt_*>,_std::equal_to<kratos::AssignStmt_*>,_std::allocator<kratos::AssignStmt_*>_>
  *__range3;
  undefined1 local_130 [8];
  string comment;
  int local_fc;
  pair<const_char_*,_int> local_f8;
  undefined1 local_e8 [8];
  mapped_type info;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_true>
  local_b8;
  undefined1 local_b0 [8];
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
  debug_info;
  undefined1 local_70 [8];
  shared_ptr<kratos::ModuleInstantiationStmt> stmt;
  shared_ptr<kratos::Generator> *child;
  iterator __end2;
  iterator __begin2;
  vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
  *__range2;
  Generator *generator_local;
  ModuleInstantiationVisitor *this_local;
  
  bVar1 = Generator::is_cloned(generator);
  if ((!bVar1) && (bVar1 = Generator::external(generator), !bVar1)) {
    Generator::get_child_generators
              ((vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                *)&__begin2,generator);
    __end2 = std::
             vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
             ::begin((vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                      *)&__begin2);
    child = (shared_ptr<kratos::Generator> *)
            std::
            vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
            ::end((vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                   *)&__begin2);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::shared_ptr<kratos::Generator>_*,_std::vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>
                                       *)&child), bVar1) {
      this_00 = &__gnu_cxx::
                 __normal_iterator<std::shared_ptr<kratos::Generator>_*,_std::vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>
                 ::operator*(&__end2)->
                 super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>;
      peVar2 = std::__shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this_00);
      pbVar3 = Generator::has_instantiated(peVar2);
      if ((*pbVar3 & 1U) == 0) {
        debug_info._M_h._M_single_bucket =
             (__node_base_ptr)
             std::__shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>::get(this_00);
        std::make_shared<kratos::ModuleInstantiationStmt,kratos::Generator*,kratos::Generator*&>
                  ((Generator **)local_70,(Generator **)&debug_info._M_h._M_single_bucket);
        if ((generator->debug & 1U) != 0) {
          puVar4 = Generator::children_debug_abi_cxx11_(generator);
          std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
          ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
                           *)local_b0,puVar4);
          peVar2 = std::
                   __shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)this_00);
          local_b8._M_cur =
               (__node_type *)
               std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
               ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
                       *)local_b0,&peVar2->instance_name);
          info._32_8_ = std::
                        unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
                        ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
                               *)local_b0);
          bVar1 = std::__detail::operator!=
                            (&local_b8,
                             (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_true>
                              *)&info.second);
          if (bVar1) {
            peVar2 = std::
                     __shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)this_00);
            pmVar5 = std::
                     unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
                     ::at((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
                           *)local_b0,&peVar2->instance_name);
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
            ::pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                    *)local_e8,pmVar5);
            peVar6 = std::
                     __shared_ptr_access<kratos::ModuleInstantiationStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<kratos::ModuleInstantiationStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_70);
            std::
            vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
            ::emplace_back<std::pair<std::__cxx11::string,unsigned_int>&>
                      ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                        *)&(peVar6->super_Stmt).super_IRNode.fn_name_ln,
                       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                        *)local_e8);
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
            ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                     *)local_e8);
          }
          peVar6 = std::
                   __shared_ptr_access<kratos::ModuleInstantiationStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<kratos::ModuleInstantiationStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_70);
          local_fc = 0xf7;
          pVar9 = std::make_pair<char_const(&)[82],int>
                            ((char (*) [82])
                             "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/src/transform.cc"
                             ,&local_fc);
          comment.field_2._8_8_ = pVar9.first;
          local_f8.second = pVar9.second;
          local_f8.first = (char *)comment.field_2._8_8_;
          std::
          vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
          ::emplace_back<std::pair<char_const*,int>>
                    ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                      *)&(peVar6->super_Stmt).super_IRNode.fn_name_ln,&local_f8);
          std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
          ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
                            *)local_b0);
        }
        peVar2 = std::
                 __shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this_00);
        Generator::get_child_comment((string *)local_130,generator,&peVar2->instance_name);
        uVar7 = std::__cxx11::string::empty();
        if ((uVar7 & 1) == 0) {
          peVar6 = std::
                   __shared_ptr_access<kratos::ModuleInstantiationStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<kratos::ModuleInstantiationStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_70);
          std::__cxx11::string::operator=
                    ((string *)&(peVar6->super_Stmt).super_IRNode.comment,(string *)local_130);
        }
        std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::ModuleInstantiationStmt,void>
                  ((shared_ptr<kratos::Stmt> *)&__range3,
                   (shared_ptr<kratos::ModuleInstantiationStmt> *)local_70);
        Generator::add_stmt(generator,(shared_ptr<kratos::Stmt> *)&__range3);
        std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)&__range3);
        peVar6 = std::
                 __shared_ptr_access<kratos::ModuleInstantiationStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<kratos::ModuleInstantiationStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_70);
        this_01 = InstantiationStmt::connection_stmt(&peVar6->super_InstantiationStmt);
        __end3 = std::
                 unordered_set<kratos::AssignStmt_*,_std::hash<kratos::AssignStmt_*>,_std::equal_to<kratos::AssignStmt_*>,_std::allocator<kratos::AssignStmt_*>_>
                 ::begin(this_01);
        st = (value_type *)
             std::
             unordered_set<kratos::AssignStmt_*,_std::hash<kratos::AssignStmt_*>,_std::equal_to<kratos::AssignStmt_*>,_std::allocator<kratos::AssignStmt_*>_>
             ::end(this_01);
        while (bVar1 = std::__detail::operator!=
                                 (&__end3.super__Node_iterator_base<kratos::AssignStmt_*,_false>,
                                  (_Node_iterator_base<kratos::AssignStmt_*,_false> *)&st), bVar1) {
          ppAVar8 = std::__detail::_Node_const_iterator<kratos::AssignStmt_*,_true,_false>::
                    operator*(&__end3);
          (*((*ppAVar8)->super_Stmt).super_IRNode._vptr_IRNode[9])();
          std::__detail::_Node_const_iterator<kratos::AssignStmt_*,_true,_false>::operator++
                    (&__end3);
        }
        peVar2 = std::
                 __shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this_00);
        stmt_00 = std::__shared_ptr<kratos::ModuleInstantiationStmt,_(__gnu_cxx::_Lock_policy)2>::
                  get((__shared_ptr<kratos::ModuleInstantiationStmt,_(__gnu_cxx::_Lock_policy)2> *)
                      local_70);
        Generator::set_instantiation_stmt(peVar2,stmt_00);
        std::__cxx11::string::~string((string *)local_130);
        std::shared_ptr<kratos::ModuleInstantiationStmt>::~shared_ptr
                  ((shared_ptr<kratos::ModuleInstantiationStmt> *)local_70);
      }
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<kratos::Generator>_*,_std::vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>
      ::operator++(&__end2);
    }
    std::
    vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
    ::~vector((vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
               *)&__begin2);
  }
  return;
}

Assistant:

void visit(Generator* generator) override {
        if (generator->is_cloned() || generator->external()) return;
        for (auto& child : generator->get_child_generators()) {
            // skip if already instantiated
            if (child->has_instantiated()) continue;
            // create instantiation statement
            auto stmt = std::make_shared<ModuleInstantiationStmt>(child.get(), generator);
            if (generator->debug) {
                // get the debug info from the add_generator, if possible
                auto debug_info = generator->children_debug();
                if (debug_info.find(child->instance_name) != debug_info.end()) {
                    auto info = debug_info.at(child->instance_name);
                    stmt->fn_name_ln.emplace_back(info);
                }
                stmt->fn_name_ln.emplace_back(std::make_pair(__FILE__, __LINE__));
            }
            auto comment = generator->get_child_comment(child->instance_name);
            if (!comment.empty()) stmt->comment = comment;
            generator->add_stmt(stmt);
            // remove the stmts that's fold into the instantiation statement
            for (auto const& st : stmt->connection_stmt()) {
                st->remove_from_parent();
            }
            child->set_instantiation_stmt(stmt.get());
        }
    }